

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistrhoPluginInternal.hpp
# Opt level: O1

void __thiscall DISTRHO::Plugin::PrivateData::~PrivateData(PrivateData *this)

{
  AudioPortWithBusId *pAVar1;
  Parameter *pPVar2;
  PortGroupWithId *pPVar3;
  PortGroupWithId *pPVar4;
  AudioPort *pAVar5;
  long lVar6;
  ParameterEnumerationValues *pPVar7;
  long lVar8;
  String *pSVar9;
  String *pSVar10;
  long lVar11;
  String *pSVar12;
  String *pSVar13;
  String *local_60;
  
  pAVar1 = this->audioPorts;
  if (pAVar1 != (AudioPortWithBusId *)0x0) {
    lVar8 = *(long *)&pAVar1[-1].super_AudioPort.groupId;
    if (lVar8 != 0) {
      pAVar5 = &pAVar1[lVar8 + -1].super_AudioPort;
      lVar8 = lVar8 * -0x40;
      do {
        pSVar12 = &pAVar5->name;
        String::~String(pSVar12 + 1);
        String::~String(pSVar12);
        pAVar5 = (AudioPort *)(pSVar12 + -3);
        lVar8 = lVar8 + 0x40;
      } while (lVar8 != 0);
    }
    operator_delete__(&pAVar1[-1].super_AudioPort.groupId);
    this->audioPorts = (AudioPortWithBusId *)0x0;
  }
  pPVar2 = this->parameters;
  if (pPVar2 != (Parameter *)0x0) {
    lVar8 = *(long *)&pPVar2[-1].groupId;
    if (lVar8 != 0) {
      lVar6 = lVar8 * 0xb0;
      local_60 = &pPVar2[-1].name;
      pSVar10 = &pPVar2[-1].shortName;
      pSVar12 = &pPVar2[-1].symbol;
      pSVar9 = &pPVar2[-1].unit;
      pSVar13 = &pPVar2[-1].description;
      pPVar7 = &pPVar2[-1].enumValues;
      lVar11 = 0;
      do {
        ParameterEnumerationValues::~ParameterEnumerationValues(pPVar7 + lVar8 * 0xb);
        String::~String((String *)((long)pSVar13 + lVar6));
        String::~String((String *)((long)pSVar9 + lVar6));
        String::~String((String *)((long)pSVar12 + lVar6));
        String::~String((String *)((long)pSVar10 + lVar6));
        String::~String((String *)((long)local_60 + lVar6));
        local_60 = (String *)((long)(local_60 + -8) + 0x10);
        pSVar10 = (String *)((long)(pSVar10 + -8) + 0x10);
        pSVar12 = (String *)((long)(pSVar12 + -8) + 0x10);
        pSVar9 = (String *)((long)(pSVar9 + -8) + 0x10);
        pSVar13 = (String *)((long)(pSVar13 + -8) + 0x10);
        pPVar7 = pPVar7 + -0xb;
        lVar11 = lVar11 + 0xb0;
      } while (lVar6 != lVar11);
    }
    operator_delete__(&pPVar2[-1].groupId);
    this->parameters = (Parameter *)0x0;
  }
  pPVar3 = this->portGroups;
  if (pPVar3 != (PortGroupWithId *)0x0) {
    lVar8 = *(long *)&pPVar3[-1].groupId;
    if (lVar8 != 0) {
      lVar6 = lVar8 * -0x38;
      pPVar4 = pPVar3 + lVar8;
      do {
        String::~String(&pPVar4[-1].super_PortGroup.symbol);
        String::~String((String *)(pPVar4 + -1));
        lVar6 = lVar6 + 0x38;
        pPVar4 = pPVar4 + -1;
      } while (lVar6 != 0);
    }
    operator_delete__(&pPVar3[-1].groupId);
    this->portGroups = (PortGroupWithId *)0x0;
  }
  if (this->bundlePath != (char *)0x0) {
    free(this->bundlePath);
    this->bundlePath = (char *)0x0;
  }
  return;
}

Assistant:

~PrivateData() noexcept
    {
#if DISTRHO_PLUGIN_NUM_INPUTS+DISTRHO_PLUGIN_NUM_OUTPUTS > 0
        if (audioPorts != nullptr)
        {
            delete[] audioPorts;
            audioPorts = nullptr;
        }
#endif

        if (parameters != nullptr)
        {
            delete[] parameters;
            parameters = nullptr;
        }

        if (portGroups != nullptr)
        {
            delete[] portGroups;
            portGroups = nullptr;
        }

#if DISTRHO_PLUGIN_WANT_PROGRAMS
        if (programNames != nullptr)
        {
            delete[] programNames;
            programNames = nullptr;
        }
#endif

#if DISTRHO_PLUGIN_WANT_STATE
        if (stateKeys != nullptr)
        {
            delete[] stateKeys;
            stateKeys = nullptr;
        }

        if (stateDefValues != nullptr)
        {
            delete[] stateDefValues;
            stateDefValues = nullptr;
        }
#endif

        if (bundlePath != nullptr)
        {
            std::free(bundlePath);
            bundlePath = nullptr;
        }
    }